

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O3

void fsnav_ins_alignment_static_accs(void)

{
  double dVar1;
  long lVar2;
  char *__nptr;
  fsnav_imu *pfVar3;
  double dVar4;
  char t0_token [10];
  char local_28 [16];
  
  builtin_strncpy(local_28,"alignment",10);
  pfVar3 = fsnav->imu;
  if (pfVar3 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_alignment_static_accs::n = 0;
      __nptr = fsnav_locate_token(local_28,pfVar3->cfg,pfVar3->cfglength,'=');
      if ((__nptr != (char *)0x0) &&
         (fsnav_ins_alignment_static_accs::t0 = atof(__nptr),
         0.0 < fsnav_ins_alignment_static_accs::t0)) {
        return;
      }
      fsnav_ins_alignment_static_accs::t0 = 300.0;
    }
    else if ((-1 < fsnav->mode) && (pfVar3->t <= fsnav_ins_alignment_static_accs::t0)) {
      (pfVar3->sol).L_valid = '\0';
      (pfVar3->sol).q_valid = '\0';
      (pfVar3->sol).rpy_valid = '\0';
      if (pfVar3->f_valid != '\0') {
        dVar1 = (double)(fsnav_ins_alignment_static_accs::n + 1);
        dVar4 = (double)fsnav_ins_alignment_static_accs::n;
        lVar2 = 0;
        fsnav_ins_alignment_static_accs::n = fsnav_ins_alignment_static_accs::n + 1;
        do {
          *(double *)((long)fsnav_ins_alignment_static_accs::f + lVar2) =
               *(double *)((long)fsnav_ins_alignment_static_accs::f + lVar2) * (dVar4 / dVar1) +
               *(double *)((long)pfVar3->f + lVar2) / dVar1;
          lVar2 = lVar2 + 8;
        } while (lVar2 != 0x18);
        dVar1 = atan2(-fsnav_ins_alignment_static_accs::f[2],fsnav_ins_alignment_static_accs::f[1]);
        (fsnav->imu->sol).rpy[0] = dVar1;
        dVar1 = atan2(fsnav_ins_alignment_static_accs::f[0],
                      SQRT(fsnav_ins_alignment_static_accs::f[1] *
                           fsnav_ins_alignment_static_accs::f[1] +
                           fsnav_ins_alignment_static_accs::f[2] *
                           fsnav_ins_alignment_static_accs::f[2]));
        pfVar3 = fsnav->imu;
        (pfVar3->sol).rpy[1] = dVar1;
        (pfVar3->sol).rpy[2] = 0.0;
      }
      (pfVar3->sol).rpy_valid = '\x01';
      fsnav_linal_rpy2mat((pfVar3->sol).L,(pfVar3->sol).rpy);
      pfVar3 = fsnav->imu;
      (pfVar3->sol).L_valid = '\x01';
      fsnav_linal_mat2quat((pfVar3->sol).q,(pfVar3->sol).L);
      pfVar3 = fsnav->imu;
      (pfVar3->sol).q_valid = '\x01';
      (pfVar3->sol).v[0] = 0.0;
      (pfVar3->sol).v[1] = 0.0;
      (pfVar3->sol).v[2] = 0.0;
      (pfVar3->sol).v_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_alignment_static_accs(void) {

	const char   t0_token[] = "alignment"; // параметр длительности выставки в конфигурационной строке
	const double t0_default = 300;         // стандартная длительность выставки

	static double 
		f[3] = {0,0,0}, // среднее значение показаний акселерометров
		t0      = -1;   // длительность выставки
	static int n = 0;   // счетчик количества измерений

	char   *cfg_ptr;    // указатель на параметр в строке конфигурации
	double  n1_n;       // (n-1)/n
	size_t  i;          // индекс

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {
		// обнуление счетчика
		n = 0;
		// парсинг длительности выставки в конфигурационной строке
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);		
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;
	}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// операции на каждом шаге
	else {
		// проверка времени выставки
		if (fsnav->imu->t > t0)
			return;
		// обнуление флагов достоверности
		fsnav->imu->sol.L_valid   = 0;
		fsnav->imu->sol.q_valid   = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// обновление среднего и углов ориентации
		if (fsnav->imu->f_valid) {
			n++;
			n1_n = (n - 1.0)/n;
			for (i = 0; i < 3; i++)
				f[i] = f[i]*n1_n + fsnav->imu->f[i]/n;

			fsnav->imu->sol.rpy[0] = atan2(-f[2], f[1]);
			fsnav->imu->sol.rpy[1] = atan2( f[0], sqrt(f[1]*f[1] + f[2]*f[2]));
			fsnav->imu->sol.rpy[2] = 0.0;
		}
		fsnav->imu->sol.rpy_valid = 1;
		// обновление матрицы ориентации
		fsnav_linal_rpy2mat(fsnav->imu->sol.L, fsnav->imu->sol.rpy);
		fsnav->imu->sol.L_valid = 1;
		// обновление кватерниона
		fsnav_linal_mat2quat(fsnav->imu->sol.q  , fsnav->imu->sol.L);
		fsnav->imu->sol.q_valid = 1;
		// обнуление скорости (поскольку предполагается статическая выставка)
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
	}
}